

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::walkStacklessQuantizedTree
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax,
          int startNodeIndex,int endNodeIndex)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  btQuantizedBvhNode *pbVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  iVar6 = 0;
  if (startNodeIndex < endNodeIndex) {
    pbVar5 = (this->m_quantizedContiguousNodes).m_data + startNodeIndex;
    iVar6 = 0;
    do {
      bVar2 = *quantizedQueryAabbMin <= pbVar5->m_quantizedAabbMax[0];
      bVar7 = pbVar5->m_quantizedAabbMin[0] <= *quantizedQueryAabbMax;
      bVar3 = quantizedQueryAabbMin[2] <= pbVar5->m_quantizedAabbMax[2];
      bVar8 = pbVar5->m_quantizedAabbMin[2] <= quantizedQueryAabbMax[2];
      bVar4 = quantizedQueryAabbMin[1] <= pbVar5->m_quantizedAabbMax[1];
      bVar9 = pbVar5->m_quantizedAabbMin[1] <= quantizedQueryAabbMax[1];
      uVar1 = pbVar5->m_escapeIndexOrTriangleIndex;
      if ((-1 < (int)uVar1) && (bVar9 && ((bVar4 && (bVar8 && bVar7)) && (bVar3 && bVar2)))) {
        (*nodeCallback->_vptr_btNodeOverlapCallback[2])
                  (nodeCallback,(ulong)(uVar1 >> 0x15),(ulong)(uVar1 & 0x1fffff));
      }
      if ((bool)(~(bVar9 && ((bVar4 && (bVar8 && bVar7)) && (bVar3 && bVar2))) & (int)uVar1 < 0)) {
        startNodeIndex = startNodeIndex - pbVar5->m_escapeIndexOrTriangleIndex;
        pbVar5 = pbVar5 + -(long)pbVar5->m_escapeIndexOrTriangleIndex;
      }
      else {
        pbVar5 = pbVar5 + 1;
        startNodeIndex = startNodeIndex + 1;
      }
      iVar6 = iVar6 + 1;
    } while (startNodeIndex < endNodeIndex);
  }
  if (maxIterations < iVar6) {
    maxIterations = iVar6;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessQuantizedTree(btNodeOverlapCallback* nodeCallback,unsigned short int* quantizedQueryAabbMin,unsigned short int* quantizedQueryAabbMax,int startNodeIndex,int endNodeIndex) const
{
	btAssert(m_useQuantization);
	
	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < endNodeIndex)
	{

//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern btIDebugDraw* debugDrawerPtr;
		if (curIndex==drawPatch)
		{
			btVector3 aabbMin,aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			btVector3	color(1,0,0);
			debugDrawerPtr->drawAabb(aabbMin,aabbMax,color);
		}
#endif//VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		btAssert (walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,rootNode->m_quantizedAabbMin,rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		
		if (isLeafNode && aabbOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(),rootNode->getTriangleIndex());
		} 
		
		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}